

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::calculateStatistics(GroupNode *this,Statistics *stat)

{
  bool bVar1;
  undefined8 in_RSI;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_RDI;
  Ref<embree::SceneGraph::Node> *c;
  iterator __end2;
  iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_28;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_20;
  undefined8 local_18;
  reference local_8;
  
  in_RDI[10]._M_current = (Ref<embree::SceneGraph::Node> *)((long)&(in_RDI[10]._M_current)->ptr + 1)
  ;
  if (in_RDI[10]._M_current == (Ref<embree::SceneGraph::Node> *)0x1) {
    local_20 = in_RDI + 0xd;
    local_18 = in_RSI;
    local_28._M_current =
         (Ref<embree::SceneGraph::Node> *)
         std::
         vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                                      *)in_stack_ffffffffffffffb8), bVar1) {
      local_8 = __gnu_cxx::
                __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                ::operator*(&local_28);
      (*(local_8->ptr->super_RefCount)._vptr_RefCount[9])(local_8->ptr,local_18);
      __gnu_cxx::
      __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void SceneGraph::GroupNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      for (auto&  c : children)
        c->calculateStatistics(stat);
    }
  }